

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersector1<8,_16777232,_false,_embree::avx512::ArrayIntersector1<embree::avx512::InstanceIntersector1MB>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  undefined4 uVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined8 uVar6;
  undefined8 uVar7;
  long lVar8;
  InstancePrimitive *prim;
  bool bVar9;
  AABBNodeMB4D *node1;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  float fVar21;
  float fVar22;
  undefined8 uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [64];
  undefined1 auVar26 [32];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [32];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  Precalculations pre;
  NodeRef stack [564];
  Precalculations local_1301;
  ulong *local_1300;
  Ray *local_12f8;
  RayQueryContext *local_12f0;
  InstancePrimitive *local_12e8;
  long local_12e0;
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  ulong local_11d8 [565];
  
  local_11d8[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_11d8[0] != 8) {
    fVar1 = ray->tfar;
    if (0.0 <= fVar1) {
      aVar3 = (ray->dir).field_0.field_1;
      auVar4 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar17._8_4_ = 0x7fffffff;
      auVar17._0_8_ = 0x7fffffff7fffffff;
      auVar17._12_4_ = 0x7fffffff;
      auVar17 = vandps_avx512vl((undefined1  [16])aVar3,auVar17);
      auVar24._8_4_ = 0x219392ef;
      auVar24._0_8_ = 0x219392ef219392ef;
      auVar24._12_4_ = 0x219392ef;
      local_1300 = local_11d8 + 1;
      uVar14 = vcmpps_avx512vl(auVar17,auVar24,1);
      bVar9 = (bool)((byte)uVar14 & 1);
      auVar18._0_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * (int)aVar3.x;
      bVar9 = (bool)((byte)(uVar14 >> 1) & 1);
      auVar18._4_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * (int)aVar3.y;
      bVar9 = (bool)((byte)(uVar14 >> 2) & 1);
      auVar18._8_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * (int)aVar3.z;
      bVar9 = (bool)((byte)(uVar14 >> 3) & 1);
      auVar18._12_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * aVar3.field_3.a;
      auVar17 = vrcp14ps_avx512vl(auVar18);
      auVar19._8_4_ = 0x3f800000;
      auVar19._0_8_ = 0x3f8000003f800000;
      auVar19._12_4_ = 0x3f800000;
      auVar19 = vfnmadd213ps_avx512vl(auVar18,auVar17,auVar19);
      auVar18 = vfmadd132ps_fma(auVar19,auVar17,auVar17);
      fVar21 = auVar18._0_4_;
      local_1238._4_4_ = fVar21;
      local_1238._0_4_ = fVar21;
      local_1238._8_4_ = fVar21;
      local_1238._12_4_ = fVar21;
      local_1238._16_4_ = fVar21;
      local_1238._20_4_ = fVar21;
      local_1238._24_4_ = fVar21;
      local_1238._28_4_ = fVar21;
      auVar17 = vmovshdup_avx(auVar18);
      uVar23 = auVar17._0_8_;
      local_1258._8_8_ = uVar23;
      local_1258._0_8_ = uVar23;
      local_1258._16_8_ = uVar23;
      local_1258._24_8_ = uVar23;
      auVar19 = vshufpd_avx(auVar18,auVar18,1);
      auVar26._8_4_ = 2;
      auVar26._0_8_ = 0x200000002;
      auVar26._12_4_ = 2;
      auVar26._16_4_ = 2;
      auVar26._20_4_ = 2;
      auVar26._24_4_ = 2;
      auVar26._28_4_ = 2;
      local_1278 = vpermps_avx2(auVar26,ZEXT1632(auVar18));
      fVar22 = fVar21 * (ray->org).field_0.m128[0];
      auVar29._8_4_ = 1;
      auVar29._0_8_ = 0x100000001;
      auVar29._12_4_ = 1;
      auVar29._16_4_ = 1;
      auVar29._20_4_ = 1;
      auVar29._24_4_ = 1;
      auVar29._28_4_ = 1;
      auVar20 = ZEXT1632(CONCAT412(auVar18._12_4_ * (ray->org).field_0.m128[3],
                                   CONCAT48(auVar18._8_4_ * (ray->org).field_0.m128[2],
                                            CONCAT44(auVar18._4_4_ * (ray->org).field_0.m128[1],
                                                     fVar22))));
      auVar29 = vpermps_avx2(auVar29,auVar20);
      auVar20 = vpermps_avx2(auVar26,auVar20);
      auVar27 = ZEXT3264(local_1258);
      uVar15 = (ulong)(fVar21 < 0.0) * 0x20;
      uVar16 = (ulong)(auVar17._0_4_ < 0.0) << 5 | 0x40;
      auVar25 = ZEXT3264(local_1238);
      uVar14 = (ulong)(auVar19._0_4_ < 0.0) << 5 | 0x80;
      local_1298._0_4_ = auVar4._0_4_;
      local_1298._4_4_ = local_1298._0_4_;
      local_1298._8_4_ = local_1298._0_4_;
      local_1298._12_4_ = local_1298._0_4_;
      local_1298._16_4_ = local_1298._0_4_;
      local_1298._20_4_ = local_1298._0_4_;
      local_1298._24_4_ = local_1298._0_4_;
      local_1298._28_4_ = local_1298._0_4_;
      local_12b8._4_4_ = fVar1;
      local_12b8._0_4_ = fVar1;
      local_12b8._8_4_ = fVar1;
      local_12b8._12_4_ = fVar1;
      local_12b8._16_4_ = fVar1;
      local_12b8._20_4_ = fVar1;
      local_12b8._24_4_ = fVar1;
      local_12b8._28_4_ = fVar1;
      auVar31 = ZEXT3264(local_12b8);
      local_12d8._0_8_ = CONCAT44(fVar22,fVar22) ^ 0x8000000080000000;
      local_12d8._8_4_ = -fVar22;
      local_12d8._12_4_ = -fVar22;
      local_12d8._16_4_ = -fVar22;
      local_12d8._20_4_ = -fVar22;
      local_12d8._24_4_ = -fVar22;
      local_12d8._28_4_ = -fVar22;
      auVar32 = ZEXT3264(local_12d8);
      auVar28 = ZEXT3264(local_1278);
      local_11f8._0_8_ = auVar29._0_8_ ^ 0x8000000080000000;
      local_11f8._8_4_ = auVar29._8_4_ ^ 0x80000000;
      local_11f8._12_4_ = auVar29._12_4_ ^ 0x80000000;
      local_11f8._16_4_ = auVar29._16_4_ ^ 0x80000000;
      local_11f8._20_4_ = auVar29._20_4_ ^ 0x80000000;
      local_11f8._24_4_ = auVar29._24_4_ ^ 0x80000000;
      local_11f8._28_4_ = auVar29._28_4_ ^ 0x80000000;
      auVar33 = ZEXT3264(local_11f8);
      auVar30 = ZEXT3264(local_1298);
      local_1218._0_8_ = auVar20._0_8_ ^ 0x8000000080000000;
      local_1218._8_4_ = auVar20._8_4_ ^ 0x80000000;
      local_1218._12_4_ = auVar20._12_4_ ^ 0x80000000;
      local_1218._16_4_ = auVar20._16_4_ ^ 0x80000000;
      local_1218._20_4_ = auVar20._20_4_ ^ 0x80000000;
      local_1218._24_4_ = auVar20._24_4_ ^ 0x80000000;
      local_1218._28_4_ = auVar20._28_4_ ^ 0x80000000;
      auVar34 = ZEXT3264(local_1218);
      local_12f8 = ray;
      local_12f0 = context;
LAB_01c7dc1e:
      if (local_1300 != local_11d8) {
        uVar11 = local_1300[-1];
        local_1300 = local_1300 + -1;
LAB_01c7dc3c:
        uVar2 = *(undefined4 *)((long)&(ray->dir).field_0 + 0xc);
        auVar20._4_4_ = uVar2;
        auVar20._0_4_ = uVar2;
        auVar20._8_4_ = uVar2;
        auVar20._12_4_ = uVar2;
        auVar20._16_4_ = uVar2;
        auVar20._20_4_ = uVar2;
        auVar20._24_4_ = uVar2;
        auVar20._28_4_ = uVar2;
        while ((uVar11 & 8) == 0) {
          uVar10 = uVar11 & 0xfffffffffffffff0;
          auVar4 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar10 + 0x100 + uVar15),auVar20,
                                   *(undefined1 (*) [32])(uVar10 + 0x40 + uVar15));
          auVar4 = vfmadd213ps_fma(ZEXT1632(auVar4),auVar25._0_32_,auVar32._0_32_);
          auVar29 = vmaxps_avx(auVar30._0_32_,ZEXT1632(auVar4));
          auVar4 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar10 + 0x100 + uVar16),auVar20,
                                   *(undefined1 (*) [32])(uVar10 + 0x40 + uVar16));
          auVar17 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar10 + 0x100 + uVar14),auVar20,
                                    *(undefined1 (*) [32])(uVar10 + 0x40 + uVar14));
          auVar4 = vfmadd213ps_fma(ZEXT1632(auVar4),auVar27._0_32_,auVar33._0_32_);
          auVar17 = vfmadd213ps_fma(ZEXT1632(auVar17),auVar28._0_32_,auVar34._0_32_);
          auVar26 = vmaxps_avx(ZEXT1632(auVar4),ZEXT1632(auVar17));
          auVar29 = vmaxps_avx(auVar29,auVar26);
          auVar4 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar10 + 0x100 + (uVar15 ^ 0x20)),auVar20,
                                   *(undefined1 (*) [32])(uVar10 + 0x40 + (uVar15 ^ 0x20)));
          auVar4 = vfmadd213ps_fma(ZEXT1632(auVar4),auVar25._0_32_,auVar32._0_32_);
          auVar26 = vminps_avx(auVar31._0_32_,ZEXT1632(auVar4));
          auVar4 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar10 + 0x100 + (uVar16 ^ 0x20)),auVar20,
                                   *(undefined1 (*) [32])(uVar10 + 0x40 + (uVar16 ^ 0x20)));
          auVar17 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar10 + 0x100 + (uVar14 ^ 0x20)),auVar20
                                    ,*(undefined1 (*) [32])(uVar10 + 0x40 + (uVar14 ^ 0x20)));
          auVar4 = vfmadd213ps_fma(ZEXT1632(auVar4),auVar27._0_32_,auVar33._0_32_);
          auVar17 = vfmadd213ps_fma(ZEXT1632(auVar17),auVar28._0_32_,auVar34._0_32_);
          auVar5 = vminps_avx(ZEXT1632(auVar4),ZEXT1632(auVar17));
          auVar26 = vminps_avx(auVar26,auVar5);
          if (((uint)uVar11 & 7) == 6) {
            uVar23 = vcmpps_avx512vl(auVar29,auVar26,2);
            uVar6 = vcmpps_avx512vl(auVar20,*(undefined1 (*) [32])(uVar10 + 0x1c0),0xd);
            uVar7 = vcmpps_avx512vl(auVar20,*(undefined1 (*) [32])(uVar10 + 0x1e0),1);
            uVar12 = (uint)uVar23 & (uint)uVar6 & (uint)uVar7;
          }
          else {
            uVar23 = vcmpps_avx512vl(auVar29,auVar26,2);
            uVar12 = (uint)uVar23;
          }
          if ((byte)uVar12 == 0) goto LAB_01c7dc1e;
          lVar8 = 0;
          for (uVar11 = (ulong)(byte)uVar12; (uVar11 & 1) == 0;
              uVar11 = uVar11 >> 1 | 0x8000000000000000) {
            lVar8 = lVar8 + 1;
          }
          uVar11 = *(ulong *)(uVar10 + lVar8 * 8);
          uVar12 = (uVar12 & 0xff) - 1 & uVar12 & 0xff;
          uVar13 = (ulong)uVar12;
          if (uVar12 != 0) goto LAB_01c7dd50;
        }
        local_12e8 = (InstancePrimitive *)(uVar11 & 0xfffffffffffffff0);
        local_12e0 = (ulong)((uint)uVar11 & 0xf) - 7;
        while( true ) {
          local_12e0 = local_12e0 + -1;
          if (local_12e0 == 0) break;
          prim = local_12e8;
          local_12e8 = local_12e8 + 1;
          bVar9 = InstanceIntersector1MB::occluded(&local_1301,ray,local_12f0,prim);
          auVar34 = ZEXT3264(local_1218);
          auVar33 = ZEXT3264(local_11f8);
          ray = local_12f8;
          if (bVar9) {
            local_12f8->tfar = -INFINITY;
            return;
          }
        }
        auVar25 = ZEXT3264(local_1238);
        auVar27 = ZEXT3264(local_1258);
        auVar28 = ZEXT3264(local_1278);
        auVar30 = ZEXT3264(local_1298);
        auVar31 = ZEXT3264(local_12b8);
        auVar32 = ZEXT3264(local_12d8);
        goto LAB_01c7dc1e;
      }
    }
  }
  return;
LAB_01c7dd50:
  do {
    *local_1300 = uVar11;
    local_1300 = local_1300 + 1;
    lVar8 = 0;
    for (uVar11 = uVar13; (uVar11 & 1) == 0; uVar11 = uVar11 >> 1 | 0x8000000000000000) {
      lVar8 = lVar8 + 1;
    }
    uVar13 = uVar13 - 1 & uVar13;
    uVar11 = *(ulong *)(uVar10 + lVar8 * 8);
  } while (uVar13 != 0);
  goto LAB_01c7dc3c;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }